

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O3

uint __thiscall FM::OPNABase::ReadRAM(OPNABase *this)

{
  uint8 *puVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar2 = this->memaddr;
  puVar1 = this->adpcmbuf;
  if ((this->control2 & 2) == 0) {
    uVar6 = (uint)puVar1[uVar2 >> 4 & 0x3ffff];
    iVar4 = 0x10;
  }
  else {
    bVar3 = (byte)uVar2 >> 1 & 7;
    uVar7 = 1 << bVar3;
    uVar5 = (ulong)(uVar2 >> 4 & 0x7fff);
    uVar6 = (puVar1[uVar5] & uVar7) +
            ((puVar1[uVar5 + 0x8000] & uVar7) + (puVar1[uVar5 + 0x10000] & uVar7) * 2 +
             (puVar1[uVar5 + 0x18000] & uVar7) * 4 + (puVar1[uVar5 + 0x20000] & uVar7) * 8 +
            ((puVar1[uVar5 + 0x28000] & uVar7) +
            (puVar1[uVar5 + 0x30000] & uVar7) * 2 + (puVar1[uVar5 + 0x38000] & uVar7) * 4) * 0x10) *
            2 >> bVar3;
    iVar4 = 2;
  }
  uVar2 = uVar2 + iVar4;
  this->memaddr = uVar2;
  if (uVar2 == this->stopaddr) {
    (**(this->super_OPNBase).super_Timer._vptr_Timer)(this,4);
    this->statusnext = 4;
    uVar2 = this->memaddr & 0x3fffff;
    this->memaddr = uVar2;
  }
  if (uVar2 == this->limitaddr) {
    this->memaddr = 0;
    uVar2 = 0;
  }
  if (uVar2 < this->stopaddr) {
    (**(this->super_OPNBase).super_Timer._vptr_Timer)(this,8);
  }
  return uVar6;
}

Assistant:

uint OPNABase::ReadRAM()
{
	uint data;
#ifndef NO_BITTYPE_EMULATION
	if (!(control2 & 2))
	{
		// 1 bit mode
		data = adpcmbuf[(memaddr >> 4) & 0x3ffff];
		memaddr += 16;
	}
	else
	{
		// 8 bit mode
		uint8* p = &adpcmbuf[(memaddr >> 4) & 0x7fff];
		uint bank = (memaddr >> 1) & 7;
		uint8 mask = 1 << bank;

		data =            (p[0x38000] & mask);
		data = data * 2 + (p[0x30000] & mask);
		data = data * 2 + (p[0x28000] & mask);
		data = data * 2 + (p[0x20000] & mask);
		data = data * 2 + (p[0x18000] & mask);
		data = data * 2 + (p[0x10000] & mask);
		data = data * 2 + (p[0x08000] & mask);
		data = data * 2 + (p[0x00000] & mask);
		data >>= bank;
		memaddr += 2;
	}
#else
	data = adpcmbuf[(memaddr >> granuality) & 0x3ffff];
	memaddr += 1 << granuality;
#endif
	if (memaddr == stopaddr)
	{
		SetStatus(4);
		statusnext = 0x04;	// EOS
		memaddr &= 0x3fffff;
	}
	if (memaddr == limitaddr)
	{
//		LOG1("Limit ! (%.8x)\n", limitaddr);
		memaddr = 0;
	}
	if (memaddr < stopaddr)
		SetStatus(8);
	return data;
}